

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void insert_arg_cache(char *code,int rule)

{
  uint uVar1;
  arg_cache *paVar2;
  int i;
  arg_cache *entry;
  int rule_local;
  char *code_local;
  
  paVar2 = (arg_cache *)allocate(0x18);
  if (paVar2 == (arg_cache *)0x0) {
    no_space();
  }
  uVar1 = strnshash(code);
  paVar2->code = code;
  paVar2->rule = rule;
  paVar2->next = arg_cache[(int)(uVar1 & 0x3ff)];
  arg_cache[(int)(uVar1 & 0x3ff)] = paVar2;
  return;
}

Assistant:

static void insert_arg_cache(char *code, int rule)
{
struct arg_cache	*entry = NEW(struct arg_cache);
int			i;

    if (!entry) no_space();
    i = strnshash(code) % ARG_CACHE_SIZE;
    entry->code = code;
    entry->rule = rule;
    entry->next = arg_cache[i];
    arg_cache[i] = entry;
}